

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# writer.h
# Opt level: O0

bool __thiscall
rapidjson::
Writer<rapidjson::BasicOStreamWrapper<std::basic_ostream<char,_std::char_traits<char>_>_>,_rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator,_0U>
::WriteString(Writer<rapidjson::BasicOStreamWrapper<std::basic_ostream<char,_std::char_traits<char>_>_>,_rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator,_0U>
              *this,Ch *str,SizeType length)

{
  bool bVar1;
  byte bVar2;
  int in_EDX;
  Ch *in_RSI;
  Writer<rapidjson::BasicOStreamWrapper<std::basic_ostream<char,_std::char_traits<char>_>_>,_rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator,_0U>
  *in_RDI;
  Ch c;
  GenericStringStream<rapidjson::UTF8<char>_> is;
  GenericStringStream<rapidjson::UTF8<char>_> *in_stack_ffffffffffffffa8;
  GenericStringStream<rapidjson::UTF8<char>_> local_40;
  Ch *local_28;
  GenericStringStream<rapidjson::UTF8<char>_> *local_10;
  GenericStringStream<rapidjson::UTF8<char>_> *local_8;
  
  local_28 = in_RSI;
  PutReserve<rapidjson::BasicOStreamWrapper<std::ostream>>
            ((BasicOStreamWrapper<std::basic_ostream<char,_std::char_traits<char>_>_> *)in_RDI->os_,
             (ulong)(in_EDX * 6 + 2));
  PutUnsafe<rapidjson::BasicOStreamWrapper<std::ostream>>
            ((BasicOStreamWrapper<std::basic_ostream<char,_std::char_traits<char>_>_> *)in_RDI,
             (Ch)((ulong)in_stack_ffffffffffffffa8 >> 0x38));
  GenericStringStream<rapidjson::UTF8<char>_>::GenericStringStream(&local_40,local_28);
  while (bVar1 = ScanWriteUnescapedString(in_RDI,in_stack_ffffffffffffffa8,0x2425b6), bVar1) {
    bVar2 = GenericStringStream<rapidjson::UTF8<char>_>::Peek(&local_40);
    if ("uuuuuuuubtnufruuuuuuuuuuuuuuuuuu"[bVar2] == '\0') {
      in_stack_ffffffffffffffa8 = (GenericStringStream<rapidjson::UTF8<char>_> *)in_RDI->os_;
      local_8 = &local_40;
      local_10 = in_stack_ffffffffffffffa8;
      GenericStringStream<rapidjson::UTF8<char>_>::Take(local_8);
      PutUnsafe<rapidjson::BasicOStreamWrapper<std::ostream>>
                ((BasicOStreamWrapper<std::basic_ostream<char,_std::char_traits<char>_>_> *)in_RDI,
                 (Ch)((ulong)in_stack_ffffffffffffffa8 >> 0x38));
    }
    else {
      GenericStringStream<rapidjson::UTF8<char>_>::Take(&local_40);
      PutUnsafe<rapidjson::BasicOStreamWrapper<std::ostream>>
                ((BasicOStreamWrapper<std::basic_ostream<char,_std::char_traits<char>_>_> *)in_RDI,
                 (Ch)((ulong)in_stack_ffffffffffffffa8 >> 0x38));
      PutUnsafe<rapidjson::BasicOStreamWrapper<std::ostream>>
                ((BasicOStreamWrapper<std::basic_ostream<char,_std::char_traits<char>_>_> *)in_RDI,
                 (Ch)((ulong)in_stack_ffffffffffffffa8 >> 0x38));
      if ("uuuuuuuubtnufruuuuuuuuuuuuuuuuuu"[bVar2] == 'u') {
        PutUnsafe<rapidjson::BasicOStreamWrapper<std::ostream>>
                  ((BasicOStreamWrapper<std::basic_ostream<char,_std::char_traits<char>_>_> *)in_RDI
                   ,(Ch)((ulong)in_stack_ffffffffffffffa8 >> 0x38));
        PutUnsafe<rapidjson::BasicOStreamWrapper<std::ostream>>
                  ((BasicOStreamWrapper<std::basic_ostream<char,_std::char_traits<char>_>_> *)in_RDI
                   ,(Ch)((ulong)in_stack_ffffffffffffffa8 >> 0x38));
        PutUnsafe<rapidjson::BasicOStreamWrapper<std::ostream>>
                  ((BasicOStreamWrapper<std::basic_ostream<char,_std::char_traits<char>_>_> *)in_RDI
                   ,(Ch)((ulong)in_stack_ffffffffffffffa8 >> 0x38));
        PutUnsafe<rapidjson::BasicOStreamWrapper<std::ostream>>
                  ((BasicOStreamWrapper<std::basic_ostream<char,_std::char_traits<char>_>_> *)in_RDI
                   ,(Ch)((ulong)in_stack_ffffffffffffffa8 >> 0x38));
      }
    }
  }
  PutUnsafe<rapidjson::BasicOStreamWrapper<std::ostream>>
            ((BasicOStreamWrapper<std::basic_ostream<char,_std::char_traits<char>_>_> *)in_RDI,
             (Ch)((ulong)in_stack_ffffffffffffffa8 >> 0x38));
  return true;
}

Assistant:

bool WriteString(const Ch* str, SizeType length)  {
        static const typename OutputStream::Ch hexDigits[16] = { '0', '1', '2', '3', '4', '5', '6', '7', '8', '9', 'A', 'B', 'C', 'D', 'E', 'F' };
        static const char escape[256] = {
#define Z16 0,0,0,0,0,0,0,0,0,0,0,0,0,0,0,0
            //0    1    2    3    4    5    6    7    8    9    A    B    C    D    E    F
            'u', 'u', 'u', 'u', 'u', 'u', 'u', 'u', 'b', 't', 'n', 'u', 'f', 'r', 'u', 'u', // 00
            'u', 'u', 'u', 'u', 'u', 'u', 'u', 'u', 'u', 'u', 'u', 'u', 'u', 'u', 'u', 'u', // 10
              0,   0, '"',   0,   0,   0,   0,   0,   0,   0,   0,   0,   0,   0,   0,   0, // 20
            Z16, Z16,                                                                       // 30~4F
              0,   0,   0,   0,   0,   0,   0,   0,   0,   0,   0,   0,'\\',   0,   0,   0, // 50
            Z16, Z16, Z16, Z16, Z16, Z16, Z16, Z16, Z16, Z16                                // 60~FF
#undef Z16
        };

        if (TargetEncoding::supportUnicode)
            PutReserve(*os_, 2 + length * 6); // "\uxxxx..."
        else
            PutReserve(*os_, 2 + length * 12);  // "\uxxxx\uyyyy..."

        PutUnsafe(*os_, '\"');
        GenericStringStream<SourceEncoding> is(str);
        while (ScanWriteUnescapedString(is, length)) {
            const Ch c = is.Peek();
            if (!TargetEncoding::supportUnicode && static_cast<unsigned>(c) >= 0x80) {
                // Unicode escaping
                unsigned codepoint;
                if (RAPIDJSON_UNLIKELY(!SourceEncoding::Decode(is, &codepoint)))
                    return false;
                PutUnsafe(*os_, '\\');
                PutUnsafe(*os_, 'u');
                if (codepoint <= 0xD7FF || (codepoint >= 0xE000 && codepoint <= 0xFFFF)) {
                    PutUnsafe(*os_, hexDigits[(codepoint >> 12) & 15]);
                    PutUnsafe(*os_, hexDigits[(codepoint >>  8) & 15]);
                    PutUnsafe(*os_, hexDigits[(codepoint >>  4) & 15]);
                    PutUnsafe(*os_, hexDigits[(codepoint      ) & 15]);
                }
                else {
                    RAPIDJSON_ASSERT(codepoint >= 0x010000 && codepoint <= 0x10FFFF);
                    // Surrogate pair
                    unsigned s = codepoint - 0x010000;
                    unsigned lead = (s >> 10) + 0xD800;
                    unsigned trail = (s & 0x3FF) + 0xDC00;
                    PutUnsafe(*os_, hexDigits[(lead >> 12) & 15]);
                    PutUnsafe(*os_, hexDigits[(lead >>  8) & 15]);
                    PutUnsafe(*os_, hexDigits[(lead >>  4) & 15]);
                    PutUnsafe(*os_, hexDigits[(lead      ) & 15]);
                    PutUnsafe(*os_, '\\');
                    PutUnsafe(*os_, 'u');
                    PutUnsafe(*os_, hexDigits[(trail >> 12) & 15]);
                    PutUnsafe(*os_, hexDigits[(trail >>  8) & 15]);
                    PutUnsafe(*os_, hexDigits[(trail >>  4) & 15]);
                    PutUnsafe(*os_, hexDigits[(trail      ) & 15]);                    
                }
            }
            else if ((sizeof(Ch) == 1 || static_cast<unsigned>(c) < 256) && RAPIDJSON_UNLIKELY(escape[static_cast<unsigned char>(c)]))  {
                is.Take();
                PutUnsafe(*os_, '\\');
                PutUnsafe(*os_, static_cast<typename OutputStream::Ch>(escape[static_cast<unsigned char>(c)]));
                if (escape[static_cast<unsigned char>(c)] == 'u') {
                    PutUnsafe(*os_, '0');
                    PutUnsafe(*os_, '0');
                    PutUnsafe(*os_, hexDigits[static_cast<unsigned char>(c) >> 4]);
                    PutUnsafe(*os_, hexDigits[static_cast<unsigned char>(c) & 0xF]);
                }
            }
            else if (RAPIDJSON_UNLIKELY(!(writeFlags & kWriteValidateEncodingFlag ? 
                Transcoder<SourceEncoding, TargetEncoding>::Validate(is, *os_) :
                Transcoder<SourceEncoding, TargetEncoding>::TranscodeUnsafe(is, *os_))))
                return false;
        }
        PutUnsafe(*os_, '\"');
        return true;
    }